

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O2

CURLcode Curl_client_write(connectdata *conn,int type,char *ptr,size_t len)

{
  char *pcVar1;
  curl_off_t *pcVar2;
  Curl_easy *pCVar3;
  CURLcode CVar4;
  short *psVar5;
  short *psVar6;
  
  pCVar3 = conn->data;
  if (len == 0) {
    len = strlen(ptr);
  }
  if (((((type & 1U) != 0) && ((conn->handler->protocol & 0xc) != 0)) &&
      ((conn->proto).ftpc.transfertype == 'A')) && (len != 0 && ptr != (char *)0x0)) {
    if ((pCVar3->state).prev_block_had_trailing_cr == true) {
      if (*ptr == '\n') {
        len = len - 1;
        memmove(ptr,ptr + 1,len);
        pcVar2 = &(pCVar3->state).crlf_conversions;
        *pcVar2 = *pcVar2 + 1;
      }
      (pCVar3->state).prev_block_had_trailing_cr = false;
    }
    psVar5 = (short *)memchr(ptr,0xd,len);
    if (psVar5 != (short *)0x0) {
      psVar6 = psVar5;
      for (; psVar5 < ptr + (len - 1); psVar5 = (short *)((long)psVar5 + 1)) {
        if (*psVar5 == 0xa0d) {
          pcVar1 = (char *)((long)psVar5 + 1);
          psVar5 = (short *)((long)psVar5 + 1);
          *(char *)psVar6 = *pcVar1;
          pcVar2 = &(pCVar3->state).crlf_conversions;
          *pcVar2 = *pcVar2 + 1;
        }
        else if ((char)*psVar5 == '\r') {
          *(char *)psVar6 = '\n';
        }
        else {
          *(char *)psVar6 = (char)*psVar5;
        }
        psVar6 = (short *)((long)psVar6 + 1);
      }
      if (psVar5 < ptr + len) {
        if ((char)*psVar5 == '\r') {
          *(char *)psVar6 = '\n';
          (pCVar3->state).prev_block_had_trailing_cr = true;
        }
        else {
          *(char *)psVar6 = (char)*psVar5;
        }
        psVar6 = (short *)((long)psVar6 + 1);
      }
      if (psVar6 < ptr + len) {
        *(char *)psVar6 = '\0';
      }
      len = (long)psVar6 - (long)ptr;
    }
  }
  CVar4 = Curl_client_chop_write(conn,type,ptr,len);
  return CVar4;
}

Assistant:

CURLcode Curl_client_write(struct connectdata *conn,
                           int type,
                           char *ptr,
                           size_t len)
{
  struct Curl_easy *data = conn->data;

  if(0 == len)
    len = strlen(ptr);

  DEBUGASSERT(type <= 3);

  /* FTP data may need conversion. */
  if((type & CLIENTWRITE_BODY) &&
    (conn->handler->protocol & PROTO_FAMILY_FTP) &&
    conn->proto.ftpc.transfertype == 'A') {
    /* convert from the network encoding */
    CURLcode result = Curl_convert_from_network(data, ptr, len);
    /* Curl_convert_from_network calls failf if unsuccessful */
    if(result)
      return result;

#ifdef CURL_DO_LINEEND_CONV
    /* convert end-of-line markers */
    len = convert_lineends(data, ptr, len);
#endif /* CURL_DO_LINEEND_CONV */
    }

  return Curl_client_chop_write(conn, type, ptr, len);
}